

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O3

void __thiscall
CP::priority_queue<int,_std::less<int>_>::push
          (priority_queue<int,_std::less<int>_> *this,int *element)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  int tmp;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = this->mSize;
  uVar5 = uVar3 + 1;
  if (this->mCap < uVar5) {
    expand(this,this->mCap * 2);
    uVar3 = this->mSize;
    uVar5 = uVar3 + 1;
  }
  iVar1 = *element;
  piVar2 = this->mData;
  piVar2[uVar3] = iVar1;
  this->mSize = uVar5;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar3 - 1;
      uVar4 = uVar5 >> 1;
      if (iVar1 < piVar2[uVar4]) break;
      piVar2[uVar3] = piVar2[uVar4];
      uVar3 = uVar4;
    } while (1 < uVar5);
  }
  piVar2[uVar3] = iVar1;
  return;
}

Assistant:

void push(const T& element) {
      if (mSize + 1 > mCap)
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
      fixUp(mSize-1);
    }